

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_error_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSStackFrame *pJVar1;
  JSShape *sh;
  JSValue JVar2;
  JSValue JVar3;
  JSValue *pJVar4;
  int iVar5;
  JSContext *pJVar6;
  JSValueUnion JVar7;
  ulong uVar8;
  JSValueUnion *pJVar9;
  ulong uVar10;
  int64_t iVar11;
  uint uVar12;
  JSValue func_obj;
  JSValue val;
  JSValue this_obj;
  JSValue enum_obj;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue prop;
  JSValue val_00;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar19;
  BOOL *in_stack_ffffffffffffff80;
  BOOL *pdone;
  JSValueUnion local_60;
  int local_44;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  JVar13.tag = new_target.tag;
  JVar7 = new_target.u;
  if ((int)new_target.tag == 3) {
    pJVar1 = ctx->rt->current_stack_frame;
    JVar7 = (JSValueUnion)(pJVar1->cur_func).u.ptr;
    JVar13.tag = (pJVar1->cur_func).tag;
  }
  JVar14.tag = JVar13.tag;
  JVar14.u.ptr = JVar7.ptr;
  JVar16.tag = JVar13.tag;
  JVar16.u.ptr = JVar7.ptr;
  v_01 = JS_GetPropertyInternal(ctx,JVar14,0x3b,JVar16,0);
  uVar12 = (uint)v_01.tag;
  JVar14 = v_01;
  if (uVar12 == 0xffffffff) {
LAB_00132711:
    v_01 = JS_NewObjectProtoClass(ctx,JVar14,3);
    if ((0xfffffff4 < (uint)JVar14.tag) &&
       (iVar5 = *JVar14.u.ptr, *(int *)JVar14.u.ptr = iVar5 + -1, iVar5 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
    if ((int)v_01.tag != 6) {
      if ((int)argv[magic == 7].tag != 3) {
        val.tag = argv[magic == 7].tag;
        val.u.ptr = argv[magic == 7].u.ptr;
        JVar13 = JS_ToStringInternal(ctx,val,0);
        if ((int)JVar13.tag != 6) {
          JS_DefinePropertyValue(ctx,v_01,0x33,JVar13,3);
          goto LAB_001327c1;
        }
LAB_00132a8c:
        js_error_constructor_cold_1();
        goto LAB_00132a9a;
      }
LAB_001327c1:
      if (magic == 7) {
        JVar13 = JS_GetIterator(ctx,*argv,0);
        local_38 = JVar13.u;
        if ((int)JVar13.tag == 6) {
          JVar14 = (JSValue)(ZEXT816(3) << 0x40);
          JVar15 = (JSValue)(ZEXT816(3) << 0x40);
          uVar8 = 0;
          JVar3 = JVar13;
        }
        else {
          uVar18 = 0;
          JVar14 = JS_GetPropertyInternal(ctx,JVar13,0x6a,JVar13,0);
          JVar3.tag = JVar13.tag;
          JVar3.u.ptr = local_38.ptr;
          if ((int)JVar14.tag == 6) {
            JVar15 = (JSValue)(ZEXT816(3) << 0x40);
            uVar8 = 0;
          }
          else {
            sh = ctx->array_shape;
            (sh->header).ref_count = (sh->header).ref_count + 1;
            JVar15 = JS_NewObjectFromShape(ctx,sh,2);
            this_obj.tag = JVar15.tag;
            uVar8 = (ulong)JVar15.u.ptr >> 0x20;
            if ((int)JVar15.tag == 6) {
              JVar3.u.ptr = local_38.ptr;
            }
            else {
              local_40 = JVar15.u;
              JVar16 = JS_IteratorNext(ctx,JVar13,JVar14,(int)&local_44,
                                       (JSValue *)CONCAT44(in_stack_ffffffffffffff7c,uVar18),
                                       in_stack_ffffffffffffff80);
              if ((int)JVar16.tag != 6) {
                uVar10 = 0;
                do {
                  pdone = (BOOL *)JVar16.tag;
                  if (local_44 != 0) {
                    uVar8 = (ulong)local_40.ptr & 0xffffffff00000000;
                    uVar10 = (ulong)local_40.ptr & 0xffffffff;
                    goto LAB_001329ae;
                  }
                  JVar7.float64 = (double)(long)uVar10;
                  if (uVar10 >> 0x1f == 0) {
                    iVar11 = 0;
                    JVar7.ptr = (void *)(uVar10 & 0xffffffff);
                  }
                  else {
                    iVar11 = 7;
                  }
                  uVar18 = JVar16.u._0_4_;
                  uVar19 = JVar16.u._4_4_;
                  this_obj.u.ptr = local_40.ptr;
                  prop.tag = iVar11;
                  prop.u.ptr = JVar7.ptr;
                  iVar5 = JS_DefinePropertyValueValue(ctx,this_obj,prop,JVar16,0x4007);
                  if (iVar5 < 0) break;
                  uVar10 = uVar10 + 1;
                  JVar13.u.ptr = local_38.ptr;
                  JVar16 = JS_IteratorNext(ctx,JVar13,JVar14,(int)&local_44,
                                           (JSValue *)CONCAT44(uVar19,uVar18),pdone);
                } while ((int)JVar16.tag != 6);
              }
              enum_obj.tag = JVar13.tag;
              enum_obj.u.ptr = local_38.ptr;
              JS_IteratorClose(ctx,enum_obj,1);
              JVar3.u.ptr = local_38.ptr;
              JVar15.tag = this_obj.tag;
              JVar15.u.ptr = local_40.ptr;
            }
          }
        }
        JVar13.tag = JVar3.tag;
        local_38 = JVar3.u;
        JVar7.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar8 << 0x20);
        if ((0xfffffff4 < (uint)JVar15.tag) &&
           (iVar5 = *JVar7.ptr, *(int *)JVar7.ptr = iVar5 + -1, iVar5 < 2)) {
          v.tag = JVar15.tag;
          v.u.ptr = JVar7.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        this_obj.tag = 6;
        uVar10 = 0;
        uVar8 = 0;
LAB_001329ae:
        local_60 = JVar14.u;
        if ((0xfffffff4 < (uint)JVar14.tag) &&
           (iVar5 = *local_60.ptr, *(int *)local_60.ptr = iVar5 + -1, iVar5 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar14);
        }
        if ((0xfffffff4 < (uint)JVar13.tag) &&
           (iVar5 = *local_38.ptr, *(int *)local_38.ptr = iVar5 + -1, iVar5 < 2)) {
          v_00.tag = JVar13.tag;
          v_00.u.ptr = local_38.ptr;
          __JS_FreeValueRT(ctx->rt,v_00);
        }
        if ((int)this_obj.tag == 6) goto LAB_00132a8c;
        val_00.tag = this_obj.tag;
        val_00.u.ptr = (void *)(uVar8 | uVar10);
        JS_DefinePropertyValue(ctx,v_01,0x34,val_00,3);
      }
      build_backtrace(ctx,v_01,(char *)0x0,0,1);
    }
LAB_00132a64:
    uVar8 = (ulong)v_01.u.ptr & 0xffffffff00000000;
  }
  else {
    if (uVar12 == 6) goto LAB_00132a64;
    if ((0xfffffff4 < uVar12) && (iVar5 = *v_01.u.ptr, *(int *)v_01.u.ptr = iVar5 + -1, iVar5 < 2))
    {
      __JS_FreeValueRT(ctx->rt,v_01);
    }
    func_obj.tag = JVar13.tag;
    func_obj.u.ptr = JVar7.ptr;
    pJVar6 = JS_GetFunctionRealm(ctx,func_obj);
    if (pJVar6 != (JSContext *)0x0) {
      if (magic < 0) {
        pJVar9 = &pJVar6->class_proto[3].u;
        pJVar4 = pJVar6->class_proto + 3;
      }
      else {
        pJVar9 = &pJVar6->native_error_proto[(uint)magic].u;
        pJVar4 = pJVar6->native_error_proto + (uint)magic;
      }
      JVar7 = (JSValueUnion)pJVar9->ptr;
      JVar13.tag = pJVar4->tag;
      JVar2.tag = JVar13.tag;
      JVar2.u.ptr = JVar7.ptr;
      v_01.tag = JVar13.tag;
      v_01.u.ptr = JVar7.ptr;
      if (0xfffffff4 < (uint)JVar13.tag) {
        *(int *)JVar7.ptr = *JVar7.ptr + 1;
        v_01 = JVar2;
      }
    }
    JVar14 = v_01;
    if (pJVar6 != (JSContext *)0x0) goto LAB_00132711;
LAB_00132a9a:
    v_01 = (JSValue)(ZEXT816(6) << 0x40);
    uVar8 = 0;
  }
  JVar17.u.ptr = (void *)((ulong)v_01.u.ptr & 0xffffffff | uVar8);
  JVar17.tag = v_01.tag;
  return JVar17;
}

Assistant:

static JSValue js_error_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv, int magic)
{
    JSValue obj, msg, proto;
    JSValueConst message;

    if (JS_IsUndefined(new_target))
        new_target = JS_GetActiveFunction(ctx);
    proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
    if (JS_IsException(proto))
        return proto;
    if (!JS_IsObject(proto)) {
        JSContext *realm;
        JSValueConst proto1;
        
        JS_FreeValue(ctx, proto);
        realm = JS_GetFunctionRealm(ctx, new_target);
        if (!realm)
            return JS_EXCEPTION;
        if (magic < 0) {
            proto1 = realm->class_proto[JS_CLASS_ERROR];
        } else {
            proto1 = realm->native_error_proto[magic];
        }
        proto = JS_DupValue(ctx, proto1);
    }
    obj = JS_NewObjectProtoClass(ctx, proto, JS_CLASS_ERROR);
    JS_FreeValue(ctx, proto);
    if (JS_IsException(obj))
        return obj;
    if (magic == JS_AGGREGATE_ERROR) {
        message = argv[1];
    } else {
        message = argv[0];
    }

    if (!JS_IsUndefined(message)) {
        msg = JS_ToString(ctx, message);
        if (unlikely(JS_IsException(msg)))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_message, msg,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    if (magic == JS_AGGREGATE_ERROR) {
        JSValue error_list = iterator_to_array(ctx, argv[0]);
        if (JS_IsException(error_list))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_errors, error_list,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    /* skip the Error() function in the backtrace */
    build_backtrace(ctx, obj, NULL, 0, JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL);
    return obj;
 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}